

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cc
# Opt level: O3

int main(void)

{
  ulong uVar1;
  undefined8 *puVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  int iVar9;
  Scalar *dst_ptr;
  ostream *poVar10;
  undefined1 (*pauVar11) [16];
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  uint uVar15;
  long lVar16;
  int i;
  Index row;
  Matrix3d *pMVar18;
  ulong uVar19;
  Matrix3d *pMVar20;
  byte bVar21;
  string *psVar29;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  Vector2d VVar28;
  MatrixXd lighttime_truth;
  MatrixXd pred_meas;
  MatrixXd true_meas;
  MatrixXd pos_ECI2;
  MatrixXd iau1980;
  MatrixXd nut80;
  Matrix3d R;
  Vector3d pos2;
  Vector3d vel1;
  MatrixXd t_R_test;
  Vector3d pos1;
  Vector3d pos_ECI;
  EGM96Grav gravmodel;
  undefined8 local_5b0;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_5a8;
  MatrixXd local_590;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  DenseStorage<double,__1,__1,__1,_0> local_560;
  MatrixXd local_548;
  DenseStorage<double,__1,__1,__1,_0> local_530;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  double local_418;
  double dStack_410;
  double local_408;
  MatrixXd local_3f8;
  MatrixXd local_3e0;
  Matrix3d local_3c8;
  string local_378;
  undefined1 local_358 [80];
  EGM96Grav *local_308;
  double dStack_300;
  double local_2f8;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  DenseStorage<double,__1,__1,__1,_0> local_2a8;
  DenseStorage<double,__1,__1,__1,_0> local_290;
  MatrixXd local_278;
  Propagator local_260;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  EGM96Grav *local_108;
  double dStack_100;
  double local_f8;
  double local_e8;
  double dStack_e0;
  double local_d8;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  EGM96Grav local_b0;
  ulong uVar17;
  
  bVar21 = 0;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 0x11;
  local_2c8 = -28738.32184;
  dStack_2c0 = -30844.07232;
  local_2b8 = -6.718;
  local_c8 = 0x7d4d1be5;
  uStack_c4 = 0x40d2b75c;
  uStack_c0 = 0xf704fa5b;
  uStack_bc = 0xc0e255a1;
  local_b8 = 0xc044859502c2d3b4;
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"../data/nut80.csv","");
  Util::LoadDatFile(&local_3e0,&local_378,0x6a,10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_438,"../data/iau1980modified.csv","");
  Util::LoadDatFile(&local_3f8,&local_438,0x449b,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  dVar4 = Util::JulianDateNatural2JD(2017.0,12.0,1.0,0.0,0.0,48.0000384);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Julian Date: ",0xd);
  poVar10 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  local_5a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x168);
  local_5a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_5a8.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 5;
  lVar16 = 0;
  do {
    *(undefined8 *)
     ((long)((local_5a8.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar16) = 0x3ff0000000000000;
    puVar2 = (undefined8 *)
             ((long)((local_5a8.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar16 + 8);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)
     ((long)((local_5a8.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar16 + 0x18) = 0;
    *(undefined8 *)
     ((long)((local_5a8.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar16 + 0x20) = 0x3ff0000000000000;
    puVar2 = (undefined8 *)
             ((long)((local_5a8.
                      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                    array + lVar16 + 0x28);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)
     ((long)((local_5a8.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar16 + 0x38) = 0;
    *(undefined8 *)
     ((long)((local_5a8.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array +
     lVar16 + 0x40) = 0x3ff0000000000000;
    lVar16 = lVar16 + 0x48;
  } while (lVar16 != 0x168);
  local_5a8.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_5a8.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 5;
  Util::ECEF2ECI(&local_3c8,dVar4,&local_3e0,&local_3f8,&local_5a8);
  local_e8 = local_2b8 *
             local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
             local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] * dStack_2c0 +
             local_2c8 *
             local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0];
  dStack_e0 = local_2b8 *
              local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] +
              local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] * dStack_2c0 +
              local_2c8 *
              local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1];
  local_d8 = local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] * local_2b8 +
             local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] * dStack_2c0 +
             local_2c8 *
             local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error [cm]: \n",0xd);
  local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 100000.0;
  local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = (double)&local_c8;
  local_260.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = (double)&local_e8;
  poVar10 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                               *)&local_260);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"../data/t_ECF_test.csv","");
  Util::LoadDatFile(&local_278,&local_458,0x361,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  local_418 = 6378.1363;
  dStack_410 = 6378.1363;
  local_408 = 6378.1363;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ECEF Test Position: \n",0x15);
  poVar10 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_418);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  dVar4 = Util::JulianDateNatural2JD(2018.0,3.0,23.0,8.0,55.0,3.0);
  local_260._0_8_ = 1.48219693752374e-323;
  local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 4.27366783652678e-321;
  local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_530,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_260);
  lVar16 = 0;
  do {
    Util::ECEF2ECI((Matrix3d *)&local_260,
                   local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data[lVar16] / 86400.0 + dVar4,&local_3e0,&local_3f8,&local_5a8);
    pMVar18 = (Matrix3d *)&local_260;
    pMVar20 = &local_3c8;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
      [0] = (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
            .array[0];
      pMVar18 = (Matrix3d *)((long)pMVar18 + ((ulong)bVar21 * -2 + 1) * 8);
      pMVar20 = (Matrix3d *)((long)pMVar20 + ((ulong)bVar21 * -2 + 1) * 8);
    }
    pauVar11 = (undefined1 (*) [16])(local_530.m_data + local_530.m_rows * lVar16);
    dVar7 = local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] * local_408 +
            dStack_410 *
            local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] +
            local_418 *
            local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
    dVar8 = local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] * local_408 +
            dStack_410 *
            local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] +
            local_418 *
            local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
    uVar24 = (undefined4)((ulong)dVar8 >> 0x20);
    if (((ulong)pauVar11 & 7) == 0) {
      if (((ulong)pauVar11 & 8) == 0) {
        auVar6._8_4_ = SUB84(dVar8,0);
        auVar6._0_8_ = dVar7;
        auVar6._12_4_ = uVar24;
        *pauVar11 = auVar6;
      }
      else {
        *(double *)*pauVar11 = dVar7;
        *(double *)(*pauVar11 + 8) = dVar8;
      }
    }
    else {
      auVar5._8_4_ = SUB84(dVar8,0);
      auVar5._0_8_ = dVar7;
      auVar5._12_4_ = uVar24;
      *pauVar11 = auVar5;
    }
    *(double *)pauVar11[1] =
         local_408 *
         local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] +
         dStack_410 *
         local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] +
         local_418 *
         local_3c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x361);
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"../data/pred_ECIpos.csv","")
  ;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_290,&local_530);
  Util::Eigen2csv(&local_478,(MatrixXd *)&local_290);
  free(local_290.m_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  VehicleState::Propagator::Propagator(&local_260);
  local_260.mu_ = 398600.4415;
  local_260.mu_sun_ = 132712440018.0;
  local_260.mu_moon_ = 4902.800066;
  local_260.AU_ = 149597870.7;
  local_260.J2_ = 0.00108248;
  local_260.J3_ = 2.5327e-06;
  local_260.Rearth_ = 6378.1363;
  local_260.earthrotationspeed_ = 7.292115146706979e-05;
  local_260.C_D_ = 1.88;
  local_260.A_ = 15.0;
  local_260.m_ = 2000.0;
  local_260.rho_0_ = 3.614e-13;
  local_260.r0_ = 7078.1363;
  local_260.H_ = 88.667;
  local_260._0_5_ = 0x100000000;
  Util::EGM96Grav::EGM96Grav(&local_b0);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_498,"../data/egm96_C_normalized.csv","");
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b8,"../data/egm96_S_normalized.csv","");
  Util::EGM96Grav::LoadNormCoeffs(&local_b0,&local_498,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  Util::EGM96Grav::NormCoeffs2Reg(&local_b0);
  local_b0.mu_ = local_260.mu_;
  local_b0.Rearth_ = local_260.Rearth_;
  local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 6984.46459301679;
  local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 1612.22237259524;
  local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 13.0914313353482;
  local_260.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = -1.67664476668291;
  local_260.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 7.26144494619245;
  local_260.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.259889921085112;
  local_260.gravmodel_ = &local_b0;
  local_b0.nut80ptr_ = &local_3e0;
  local_b0.iau1980ptr_ = &local_3f8;
  local_260.t_JD_ = Util::JulianDateNatural2JD(2018.0,2.0,1.0,5.0,0.0,0.0);
  local_260.abstol_ = 1e-16;
  local_260.dt_var_ = 0.1;
  local_260.reltol_._0_4_ = 0xa4f8e0b4;
  local_260.reltol_._4_4_ = 0x3d20e374;
  local_260._0_5_ = 0x101010101;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4d8,"../data/lighttime_truth.csv","");
  Util::LoadDatFile(&local_590,&local_4d8,0x71,7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f8,"../data/LEO_Data_Apparent.csv","");
  Util::LoadDatFile(&local_548,&local_4f8,0x71,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  local_358._0_8_ = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x2;
  local_358._8_8_ = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x71;
  local_358._16_8_ = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_560,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_358);
  local_260.dt_var_ = -0.1;
  lVar13 = 0;
  lVar16 = 0;
  do {
    local_260.t_ = local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data
                   [lVar16 + local_590.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows * 6];
    local_308 = (EGM96Grav *)
                local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[lVar16];
    dStack_300 = local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [lVar16 + local_590.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows];
    local_2f8 = local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[lVar16 + local_590.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_rows * 2];
    local_2e8 = local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[lVar16 + local_590.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_rows * 3];
    dStack_2e0 = local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [lVar16 + local_590.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows * 4];
    local_2d8 = local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[lVar16 + local_590.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_rows * 5];
    dVar4 = local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data[local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * 2 + lVar16] / 299792.0;
    local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)local_308;
    local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dStack_300;
    local_260.pos_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_2f8;
    local_260.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = local_2e8;
    local_260.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dStack_2e0;
    local_260.vel_.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_2d8;
    local_108 = local_308;
    dStack_100 = dStack_300;
    local_f8 = local_2f8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pos1: \n",7);
    poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_108);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pos2: \n",7);
    poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_308);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Pos1 + tof*Vel1: \n",0x12);
    local_358._32_8_ = &local_2e8;
    local_358._0_8_ = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_108;
    local_358._24_8_ = dVar4;
    poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                 *)local_358);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tof: ",5);
    poVar10 = std::ostream::_M_insert<double>(dVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Pos1 + tof*Vel1 - Pos2: \n",0x19);
    local_358._40_8_ = &local_2e8;
    local_358._64_8_ = &local_308;
    local_358._8_8_ = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_108;
    local_358._32_8_ = dVar4;
    poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                 *)local_358);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    iVar9 = (int)local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[lVar16];
    uVar26 = 0xd4fdf3b6;
    uVar27 = 0x409026f8;
    uVar24 = 0x810624dd;
    uVar22 = 0xc0b7ff95;
    uVar23 = 0;
    uVar25 = 0x40955100;
    if (iVar9 != 1) {
      if (iVar9 == 2) {
        uVar24 = 0x147ae148;
        uVar22 = 0x409dcd2e;
        uVar23 = 0x5c28f5c3;
        uVar25 = 0x40b78ecf;
        uVar26 = 0xb645a1cb;
        uVar27 = 0xc08988f3;
      }
      else if (iVar9 == 3) {
        uVar26 = 0xdf3b645a;
        uVar27 = 0x409f2a4f;
        uVar24 = 0xb851eb85;
        uVar22 = 0x40a2ac9e;
        uVar23 = 0x4bc6a7f0;
        uVar25 = 0xc0b5bc57;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: bad case in measurement \n",0x20);
        uVar26 = (undefined4)local_5b0;
        uVar27 = (undefined4)((ulong)local_5b0 >> 0x20);
        uVar24 = local_578;
        uVar22 = uStack_574;
        uVar23 = uStack_570;
        uVar25 = uStack_56c;
      }
    }
    local_260.t_ = local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data
                   [local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows * 6 + lVar16];
    local_5b0 = CONCAT44(uVar27,uVar26);
    local_118 = CONCAT44(uVar27,uVar26);
    local_578 = uVar24;
    uStack_574 = uVar22;
    uStack_570 = uVar23;
    uStack_56c = uVar25;
    local_128 = uVar24;
    uStack_124 = uVar22;
    uStack_120 = uVar23;
    uStack_11c = uVar25;
    VVar28 = VehicleState::Propagator::GetRangeAndRate
                       ((Propagator *)local_358,(Vector3d *)&local_260,dVar4);
    psVar29._0_4_ =
         VVar28.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
         [0]._0_4_;
    pdVar12 = local_560.m_data + local_560.m_rows * lVar16;
    if (((ulong)pdVar12 & 7) == 0) {
      uVar15 = (uint)((ulong)pdVar12 >> 3) & 1;
      uVar17 = (ulong)uVar15;
      if (((ulong)pdVar12 >> 3 & 1) != 0) {
        psVar29._0_4_ = (string *)local_358._0_8_;
        *pdVar12 = (double)local_358._0_8_;
      }
      uVar19 = (ulong)(2 - uVar15 & 0xfffffffe);
      uVar1 = uVar19 + uVar17;
      if (uVar19 != 0) {
        uVar19 = uVar17;
        do {
          lVar3 = uVar19 * 8;
          psVar29._0_4_ = *(string **)(local_358 + lVar3);
          uVar24 = *(undefined4 *)(local_358 + lVar3 + 4);
          uVar22 = *(undefined4 *)(local_358 + lVar3 + 8);
          uVar23 = *(undefined4 *)(local_358 + lVar3 + 0xc);
          puVar2 = (undefined8 *)((long)local_560.m_data + uVar19 * 8 + local_560.m_rows * lVar13);
          *puVar2 = psVar29._0_4_;
          *(undefined4 *)((long)puVar2 + 4) = uVar24;
          *(undefined4 *)(puVar2 + 1) = uVar22;
          *(undefined4 *)((long)puVar2 + 0xc) = uVar23;
          uVar19 = uVar19 + 2;
        } while (uVar19 < uVar1);
      }
      if (uVar17 != 0) {
        uVar17 = (ulong)(uint)((int)uVar1 << 3);
        pdVar12 = (double *)((long)pdVar12 + uVar17);
        pdVar14 = (double *)(local_358 + uVar17);
        goto LAB_001054ab;
      }
    }
    else {
      *pdVar12 = (double)local_358._0_8_;
      pdVar12 = pdVar12 + 1;
      pdVar14 = (double *)(local_358 + 8);
LAB_001054ab:
      psVar29._0_4_ = SUB84(*pdVar14,0);
      *pdVar12 = *pdVar14;
    }
    lVar16 = lVar16 + 1;
    lVar13 = lVar13 + 8;
    if (lVar16 == 0x71) {
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                (psVar29._0_4_,&local_518,"../data/pred_meas.csv","");
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_2a8,&local_560);
      Util::Eigen2csv(&local_518,(MatrixXd *)&local_2a8);
      free(local_2a8.m_data);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
      }
      free(local_560.m_data);
      free(local_548.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_590.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_b0.S_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_b0.S_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_b0.C_norm_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_b0.C_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_260.STM_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data);
      free(local_530.m_data);
      free(local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      if (local_5a8.
          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5a8.
                        super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_5a8.
                              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_5a8.
                              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      free(local_3f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_3e0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {

	//////////////// Test ECI to ECEF //////////////////

	//precision
	std::cout << std::setprecision(17);

	//initialize position and time
	Eigen::Vector3d pos_ECEF(-28738.3218400000, -30844.0723200000, -6.71800000000000);

	//target position
	Eigen::Vector3d targ_pos_ECI(19165.44514777874, -37549.06140374086, -41.043609948282580);

	//load some data files
	Eigen::MatrixXd nut80 = Util::LoadDatFile("../data/nut80.csv", 106, 10);
	Eigen::MatrixXd iau1980 = Util::LoadDatFile("../data/iau1980modified.csv",17563, 5);

	//check Julian date algorithm
	double t_JD = Util::JulianDateNatural2JD(2017.0, 12.0, 1.0, 0.0, 0.0, 48.0000384);

	std::cout << "Julian Date: " << t_JD << "\n";

	// get rotation matrix
	std::vector<Eigen::Matrix3d> matvec(5, Eigen::Matrix3d::Identity(3,3));
	Eigen::Matrix3d R = Util::ECEF2ECI(t_JD, &nut80, &iau1980, &matvec);

	//rotate
	Eigen::Vector3d pos_ECI = R*pos_ECEF;

	//error
	std::cout << "Error [cm]: \n" << 100.0*1000.0*(targ_pos_ECI - pos_ECI) << "\n";

	//load the test times
	Eigen::MatrixXd t_R_test = Util::LoadDatFile("../data/t_ECF_test.csv",865,1);

	//load test position
	// Eigen::MatrixXd r_ECF_test = Util::LoadDatFile("../data/r_ECF_test.csv",1,3);
	Eigen::Vector3d pos_ECEF2(6378.136300000000, 6378.136300000000, 6378.136300000000);

	std::cout << "ECEF Test Position: \n" << pos_ECEF2 << "\n";

	//reset julian date to project epoch
	t_JD = Util::JulianDateNatural2JD(2018.0, 3.0, 23.0, 8.0, 55.0, 3.0);

	//initialize ECI matrix
	Eigen::MatrixXd pos_ECI2 = Eigen::MatrixXd::Zero(3,865);

	//perform rotations
	for (int i = 0; i < 865; ++i)	{
		R = Util::ECEF2ECI(t_JD + t_R_test(i,0)/(24.0*60.0*60.0), &nut80, &iau1980, &matvec);
		pos_ECI2.block(0,i,3,1) = R*pos_ECEF2;
	}

	//save data
	Util::Eigen2csv("../data/pred_ECIpos.csv", pos_ECI2);


	// exit(0);s
	////////////////////////////////////////////////////


	///////////////// Test Propagator /////////////////////

	//form a propagator object
	VehicleState::Propagator propobj;

	//set physics constants
	propobj.mu_ = 398600.4415; // km^3/sec^2
	propobj.mu_sun_ = 132712440018.0; //km^3/sec^2
	propobj.mu_moon_ = 4902.800066; //km^3/sec^2
	propobj.AU_ = 149597870.7;
	propobj.J2_ = 0.00108248;
	propobj.J3_ = 0.0000025327;
	propobj.Rearth_ = 6378.1363; //km
	propobj.earthrotationspeed_ = 7.292115146706979 * pow(10.0,-5.0); // rad/sec
	propobj.C_D_ = 1.88;
	propobj.A_ = 15; // m^2
	propobj.m_ = 2000.0; //kg
	propobj.rho_0_ = 3.614*pow(10.0,-13.0); //kg/m^3
	propobj.r0_ = 700.0 + propobj.Rearth_; //km
	propobj.H_ = 88.6670; //km

	//parameters
	propobj.useJ2_ = false;
	propobj.use20x20_ = true;
	propobj.usedrag_ = false;
	propobj.useSRP_ = false;
	propobj.useLuniSolar_ = false; //gravity of sun and moon

	//form a gravity object
	Util::EGM96Grav gravmodel;
	gravmodel.LoadNormCoeffs("../data/egm96_C_normalized.csv", "../data/egm96_S_normalized.csv");
	gravmodel.NormCoeffs2Reg();
	gravmodel.mu_ = propobj.mu_;
	gravmodel.Rearth_ = propobj.Rearth_;
	gravmodel.nut80ptr_ = &nut80; 
	gravmodel.iau1980ptr_ = &iau1980;
	propobj.gravmodel_ = &gravmodel;

	//set objects position and velocity (from lighttime_truth.mat)
	Eigen::Vector3d pos0;
	pos0[0] = 6984.46459301679;
	pos0[1] = 1612.22237259524;
	pos0[2] = 13.0914313353482;

	Eigen::Vector3d vel0;
	vel0[0] = -1.67664476668291;
	vel0[1] = 7.26144494619245;
	vel0[2] =  0.259889921085112;

	//set objects position and velocity (from HW5 assignment)
	// Eigen::Vector3d pos0;
	// pos0[0] = 6990077.798814194;
	// pos0[1] = 1617465.311978378;
	// pos0[2] = 22679.810569245355;
	// pos0 = pos0/1000.0; //convert units

	// Eigen::Vector3d vel0;
	// vel0[0] = -1675.13972506056;
	// vel0[1] = 7273.72441330686;
	// vel0[2] =  252.688512916741;
	// vel0 = vel0/1000.0; //convert units

	propobj.pos_ = pos0;
	propobj.vel_ = vel0;

	propobj.t_JD_ = Util::JulianDateNatural2JD(2018.0, 2.0, 1.0, 5.0, 0.0, 0.0);

	//set tolerance options
	propobj.abstol_ = 1.0*pow(10.0,-16.0);
	propobj.reltol_ = 3.0*pow(10.0,-14.0);
	propobj.dt_var_ = 0.1;

	// propagate
	// propobj.Propagate(21600.0, false);

	//true final position and velocity

	//lighttime_truth.mat
	// Eigen::Vector3d posf_true(-5153.82535324096, -4954.3861758395, -144.823727065817);
	// Eigen::Vector3d velf_true(5.17802136652852, -5.38752135424995, -0.211929233793885);

	// .xlsx file (20x20 only)
	Eigen::Vector3d posf_true(-5153.77192464701, -4954.43582198601, -144.832817220038);
	Eigen::Vector3d velf_true(5.17808108556007, -5.38747088174872, -0.211928868806419);

	//output
	// std::cout << "Final Position:\n" << propobj.pos_ << "\n" << "Error [m]:\n" << 1000.0*(propobj.pos_ - posf_true) << "\n";
	// std::cout << "Final Velocity:\n" << propobj.vel_ << "\n" << "Error [m/sec]:\n" << 1000.0*(propobj.vel_ - velf_true) << "\n";

	//////////////////////////////////////////////////////////////

	//////////////// Test Measurement Predictions /////////////////////

	//simple propagation
	propobj.useJ2_ = true;
	propobj.use20x20_ = true;
	propobj.usedrag_ = true;
	propobj.useSRP_ = true;
	propobj.useLuniSolar_ = true; //gravity of sun and moon

	// load true state and measurements
	Eigen::MatrixXd lighttime_truth = Util::LoadDatFile("../data/lighttime_truth.csv",113, 7);
	Eigen::MatrixXd true_meas = Util::LoadDatFile("../data/LEO_Data_Apparent.csv",113, 4);
	//initialize predicted measurements
	Eigen::MatrixXd pred_meas = Eigen::MatrixXd::Zero(2,113);

	//set observation station ECEF location
	Eigen::Vector3d obs_station1{-6143.584, 1364.250, 1033.743}; //atoll / Kwajalein
	Eigen::Vector3d obs_station2{1907.295, 6030.810, -817.119}; //diego garcia
	Eigen::Vector3d obs_station3{2390.310, -5564.341, 1994.578}; //arecibo

	double c = 299792.0; //speed of light km/sec

	propobj.dt_var_ = -0.1; //only doing backwards props

	//vector for use with choosing station
	Eigen::Vector3d obs_station_iter;

	// cycle through all the measurements, create a predicted measurement at each
	for (int i = 0; i < 113; ++i){
		
		//set time of object
		propobj.t_ = lighttime_truth(i,6);

		//set true state of object
		propobj.pos_ = lighttime_truth.block(i,0,1,3).transpose();
		propobj.vel_ = lighttime_truth.block(i,3,1,3).transpose();

		Eigen::Vector3d pos1;
		Eigen::Vector3d vel1;
		Eigen::Vector3d pos2 = propobj.pos_;
		Eigen::Vector3d vel2 = propobj.vel_;

		//approximate tof
		double tof = true_meas(i,2)/c;

		//propagate backwards in time to measurement
		// propobj.Propagate(-1.0*tof,false);

		pos1 = propobj.pos_;
		vel1 = propobj.vel_;

		std::cout << "Pos1: \n" << pos1 << "\n";
		std::cout << "Pos2: \n" << pos2 << "\n";
		std::cout << "Pos1 + tof*Vel1: \n" << pos1 + tof*vel1 << "\n";
		std::cout << "tof: " << tof << "\n";
		std::cout << "Pos1 + tof*Vel1 - Pos2: \n" << pos1 + tof*vel1 - pos2 << "\n";	

		//determine which tracking station was used
		int stationID = (int) true_meas(i, 0);

		switch(stationID) {
			case 1:
				obs_station_iter = obs_station1;
				break;

			case 2:
				obs_station_iter = obs_station2;
				break;

			case 3:
				obs_station_iter = obs_station3;
				break;

			default: std::cout << "Error: bad case in measurement \n";
		}

		//reset time
		propobj.t_ = lighttime_truth(i,6);

		//approximate measurement
		pred_meas.block(0,i,2,1) = propobj.GetRangeAndRate(obs_station_iter, 1.0*tof);

		// for (int j = 0; j < 5; ++j){

		// 	//approximate measurement
		// 	pred_meas.block(0,i,2,1) = propobj.GetRangeAndRate(obs_station_iter, 1.0*tof);

		// 	std::cout << "Change in ToF: " << tof - pred_meas(0,i)/c << "\n";

		// 	//reset time of flight
		// 	tof = pred_meas(0,i)/c;
		// }
		

		// exit(0);

	}

	//write out the predicted measurements
	Util::Eigen2csv("../data/pred_meas.csv", pred_meas);

	return 0;
}